

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

bool __thiscall
kws::Parser::IsBetweenChars
          (Parser *this,char begin,char end,size_t pos,bool withComments,string *buffer)

{
  pointer pcVar1;
  ulong pos_00;
  size_t sVar2;
  bool bVar3;
  string stream;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  local_90[0] = local_80;
  pcVar1 = (buffer->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + buffer->_M_string_length);
  if ((buffer->_M_string_length == 0) &&
     (std::__cxx11::string::_M_assign((string *)local_90), withComments)) {
    std::__cxx11::string::_M_assign((string *)local_90);
  }
  if (pos != 0xffffffffffffffff) {
    pos_00 = std::__cxx11::string::find((char)local_90,(ulong)(uint)(int)begin);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar1 = (buffer->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + buffer->_M_string_length);
    sVar2 = FindClosingChar(this,begin,end,pos_00,!withComments,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (pos_00 < sVar2 && sVar2 != 0xffffffffffffffff) {
      while (bVar3 = pos < sVar2 && pos_00 < pos, pos >= sVar2 || pos_00 >= pos) {
        pos_00 = std::__cxx11::string::find((char)local_90,(ulong)(uint)(int)begin);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar1 = (buffer->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar1,pcVar1 + buffer->_M_string_length);
        sVar2 = FindClosingChar(this,begin,end,pos_00,!withComments,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((sVar2 <= pos_00) || (sVar2 == 0xffffffffffffffff)) break;
      }
      goto LAB_0012510f;
    }
  }
  bVar3 = false;
LAB_0012510f:
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  return bVar3;
}

Assistant:

bool Parser::IsBetweenChars(const char begin, const char end ,size_t pos,
                            bool withComments,std::string buffer) const
{
  std::string stream = buffer;
  if (buffer.empty()) {
    stream = m_BufferNoComment;
    if(withComments)
      {
      stream = m_Buffer;
      }
  }

  if(pos == std::string::npos)
    {
    return false;
    }

  size_t b0 = stream.find(begin,0);
  size_t b1 = this->FindClosingChar(begin,end,b0,!withComments,buffer);

  while(b0 != std::string::npos && b1 != std::string::npos && b1>b0)
    {
    if(pos>b0 && pos<b1)
      {
      return true;
      }
    b0 = stream.find(begin,b0+1);
    b1 = this->FindClosingChar(begin,end,b0,!withComments,buffer);
    }
  return false;
}